

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

void immutable::rrb_details::release<char>(internal_node<char,_false> *p_node)

{
  uint32_t uVar1;
  rrb_size_table<false> *__ptr;
  internal_node<char,_false> *p_node_00;
  ulong uVar2;
  
  if ((p_node != (internal_node<char,_false> *)0x0) &&
     (uVar1 = p_node->_ref_count, p_node->_ref_count = uVar1 - 1, uVar1 == 1)) {
    __ptr = (p_node->size_table).ptr;
    if ((__ptr != (rrb_size_table<false> *)0x0) &&
       (uVar1 = __ptr->_ref_count, __ptr->_ref_count = uVar1 - 1, uVar1 == 1)) {
      free(__ptr);
    }
    if (p_node->len != 0) {
      uVar2 = 0;
      do {
        p_node_00 = p_node->child[uVar2].ptr;
        if ((p_node_00 == (internal_node<char,_false> *)0x0) || (p_node_00->type != LEAF_NODE)) {
          release<char>(p_node_00);
        }
        else {
          uVar1 = p_node_00->_ref_count;
          p_node_00->_ref_count = uVar1 - 1;
          if (uVar1 == 1) {
            free(p_node_00);
          }
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < p_node->len);
    }
    free(p_node);
    return;
  }
  return;
}

Assistant:

inline void release(const internal_node<T, false>* p_node)
      {
      if (p_node)
        {
        if (1 == p_node->_ref_count--)
          {
          p_node->size_table.dec();
          for (uint32_t i = 0; i < p_node->len; ++i)
            {
            if (p_node->child[i].ptr && p_node->child[i]->type == LEAF_NODE)
              {
              release((leaf_node<T, false>*)p_node->child[i].ptr);
              }
            else
              release(p_node->child[i].ptr);
            }
          free((void*)p_node);
          }
        }
      }